

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int nextStronghold(StrongholdIter *sh,Generator *g)

{
  int iVar1;
  ulong validM;
  uint64_t uVar2;
  Pos PVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong validB;
  ulong uVar8;
  double dVar9;
  uint64_t *rng;
  ulong local_38;
  
  validM = 0;
  validB = 0;
  for (lVar7 = 0; iVar1 = sh->mc, lVar7 != 0x40; lVar7 = lVar7 + 1) {
    iVar1 = isStrongholdBiome(iVar1,(uint)lVar7);
    uVar6 = 1L << ((byte)lVar7 & 0x3f);
    uVar5 = 0;
    if (iVar1 != 0) {
      uVar5 = uVar6;
    }
    iVar1 = isStrongholdBiome(sh->mc,(uint)lVar7 | 0x80);
    uVar8 = 0;
    if (iVar1 != 0) {
      uVar8 = uVar6;
    }
    validB = validB | uVar5;
    validM = validM | uVar8;
  }
  if (iVar1 < 0x18) {
    if (iVar1 < 2) {
      return 0;
    }
    iVar1 = (sh->nextapprox).x;
    iVar4 = (sh->nextapprox).z;
    rng = &sh->rnds;
  }
  else {
    if (g == (Generator *)0x0) {
      nextLong(&sh->rnds);
      PVar3 = sh->nextapprox;
      goto LAB_00108162;
    }
    uVar2 = nextLong(&sh->rnds);
    local_38 = uVar2 & 0xffffffffffff ^ 0x5deece66d;
    rng = &local_38;
    iVar1 = (sh->nextapprox).x;
    iVar4 = (sh->nextapprox).z;
  }
  PVar3 = locateBiome(g,iVar1,0,iVar4,0x70,validB,validM,rng,(int *)0x0);
LAB_00108162:
  (sh->pos).x = PVar3.x & 0xfffffff0U | 4;
  (sh->pos).z = PVar3.z & 0xfffffff0U | 4;
  iVar1 = sh->ringidx + 1;
  sh->ringidx = iVar1;
  sh->angle = 6.283185307179586 / (double)sh->ringmax + sh->angle;
  if (iVar1 == sh->ringmax) {
    iVar4 = sh->ringnum;
    sh->ringnum = iVar4 + 1;
    sh->ringidx = 0;
    iVar1 = (iVar1 * 2) / (iVar4 + 2) + iVar1;
    iVar4 = 0x80 - sh->index;
    if (iVar1 < iVar4) {
      iVar4 = iVar1;
    }
    sh->ringmax = iVar4;
    dVar9 = nextDouble(&sh->rnds);
    sh->angle = dVar9 * 3.141592653589793 + dVar9 * 3.141592653589793 + sh->angle;
  }
  if (sh->mc < 0xc) {
    dVar9 = nextDouble(&sh->rnds);
    dVar9 = (dVar9 + 1.25) * 32.0;
  }
  else {
    iVar1 = sh->ringnum;
    dVar9 = nextDouble(&sh->rnds);
    dVar9 = (dVar9 + -0.5) * 32.0 * 2.5 + (double)iVar1 * 6.0 * 32.0 + 128.0;
  }
  sh->dist = dVar9;
  dVar9 = cos(sh->angle);
  dVar9 = round(dVar9 * sh->dist);
  (sh->nextapprox).x = (int)dVar9 << 4 | 8;
  dVar9 = sin(sh->angle);
  dVar9 = round(dVar9 * sh->dist);
  (sh->nextapprox).z = (int)dVar9 << 4 | 8;
  iVar1 = sh->index;
  sh->index = iVar1 + 1;
  iVar4 = 3;
  if (0xb < sh->mc) {
    iVar4 = 0x80;
  }
  return iVar4 - iVar1;
}

Assistant:

int nextStronghold(StrongholdIter *sh, const Generator *g)
{
    uint64_t validB = 0, validM = 0;
    int i;
    for (i = 0; i < 64; i++)
    {
        if (isStrongholdBiome(sh->mc, i))
            validB |= (1ULL << i);
        if (isStrongholdBiome(sh->mc, i+128))
            validM |= (1ULL << i);
    }

    if (sh->mc > MC_1_19_2)
    {
        if (g)
        {
            uint64_t lbr = sh->rnds;
            setSeed(&lbr, nextLong(&sh->rnds));
            sh->pos = locateBiome(g, sh->nextapprox.x, 0, sh->nextapprox.z, 112,
                validB, validM, &lbr, NULL);
        }
        else
        {
            nextLong(&sh->rnds);
            sh->pos = sh->nextapprox;
        }
    }
    else if (sh->mc >= MC_B1_8)
    {
        sh->pos = locateBiome(g, sh->nextapprox.x, 0, sh->nextapprox.z, 112,
            validB, validM, &sh->rnds, NULL);
    }
    else
    {
        return 0;
    }
    // staircase is located at (4, 4) in chunk
    sh->pos.x = (sh->pos.x & ~15) + 4;
    sh->pos.z = (sh->pos.z & ~15) + 4;

    sh->ringidx++;
    sh->angle += 2 * PI / sh->ringmax;

    if (sh->ringidx == sh->ringmax)
    {
        sh->ringnum++;
        sh->ringidx = 0;
        sh->ringmax = sh->ringmax + 2*sh->ringmax / (sh->ringnum+1);
        if (sh->ringmax > 128-sh->index)
            sh->ringmax = 128-sh->index;
        sh->angle += nextDouble(&sh->rnds) * PI * 2.0;
    }

    if (sh->mc >= MC_1_9)
    {
        sh->dist = (4.0 * 32.0) + (6.0 * sh->ringnum * 32.0) +
            (nextDouble(&sh->rnds) - 0.5) * 32 * 2.5;
    }
    else
    {
        sh->dist = (1.25 + nextDouble(&sh->rnds)) * 32.0;
    }

    sh->nextapprox.x = ((int)round(cos(sh->angle) * sh->dist) * 16) + 8;
    sh->nextapprox.z = ((int)round(sin(sh->angle) * sh->dist) * 16) + 8;
    sh->index++;

    return (sh->mc >= MC_1_9 ? 128 : 3) - (sh->index-1);
}